

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_mem.cpp
# Opt level: O2

size_t phyr::getL1CacheLineSize(void)

{
  size_t sVar1;
  undefined1 auStack_228 [8];
  size_t l1sz;
  fstream fs;
  
  std::fstream::fstream(&fs);
  std::ios::exceptions((int)auStack_228 + (int)*(undefined8 *)(_fs + -0x18) + 0x10);
  l1sz = 0x40;
  std::fstream::open((char *)&fs,0x1797b8);
  std::istream::_M_extract<unsigned_long>((ulong *)&fs);
  sVar1 = l1sz;
  std::fstream::~fstream(&fs);
  return sVar1;
}

Assistant:

size_t getL1CacheLineSize() {
    std::fstream fs;
    // Set fstream to throw an exception in case of a failure
    fs.exceptions(fs.exceptions() | std::ios::failbit);

    // Data path for L1 cache (Unix systems)
    const char* cacheDataPath = "/sys/devices/system/cpu/cpu0"
                                "/cache/index1/coherency_line_size";

    size_t l1sz = DEF_PHYR_L1_CACHE_LINESZ;
    try {
        fs.open(cacheDataPath, std::fstream::in);
        fs >> l1sz;
    } catch (std::ios::failure&) {}

    return l1sz;
}